

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O2

void print_string(string *path,string *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)path);
  poVar1 = std::operator<<(poVar1,": string: ");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
print_string(std::string const& path, std::string const& value)
{
    std::cout << path << ": string: " << value << std::endl;
}